

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xpathInternals(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  int iVar95;
  int iVar96;
  int iVar97;
  int iVar98;
  int iVar99;
  int iVar100;
  int iVar101;
  int iVar102;
  int iVar103;
  int iVar104;
  int iVar105;
  int iVar106;
  int iVar107;
  int iVar108;
  int iVar109;
  int iVar110;
  int iVar111;
  int iVar112;
  int iVar113;
  uint uVar114;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing xpathInternals : 106 of 117 functions ...\n");
  }
  iVar1 = test_valuePop();
  iVar2 = test_valuePush();
  iVar3 = test_xmlXPathAddValues();
  iVar4 = test_xmlXPathBooleanFunction();
  iVar5 = test_xmlXPathCeilingFunction();
  iVar6 = test_xmlXPathCompareValues();
  iVar7 = test_xmlXPathConcatFunction();
  iVar8 = test_xmlXPathContainsFunction();
  iVar9 = test_xmlXPathCountFunction();
  iVar10 = test_xmlXPathDebugDumpCompExpr();
  iVar11 = test_xmlXPathDebugDumpObject();
  iVar12 = test_xmlXPathDifference();
  iVar13 = test_xmlXPathDistinct();
  iVar14 = test_xmlXPathDistinctSorted();
  iVar15 = test_xmlXPathDivValues();
  iVar16 = test_xmlXPathEqualValues();
  iVar17 = test_xmlXPathErr();
  iVar18 = test_xmlXPathEvalExpr();
  iVar19 = test_xmlXPathEvaluatePredicateResult();
  iVar20 = test_xmlXPathFalseFunction();
  iVar21 = test_xmlXPathFloorFunction();
  iVar22 = test_xmlXPathFunctionLookup();
  iVar23 = test_xmlXPathFunctionLookupNS();
  iVar24 = test_xmlXPathHasSameNodes();
  iVar25 = test_xmlXPathIdFunction();
  iVar26 = test_xmlXPathIntersection();
  iVar27 = test_xmlXPathIsNodeType();
  iVar28 = test_xmlXPathLangFunction();
  iVar29 = test_xmlXPathLastFunction();
  iVar30 = test_xmlXPathLeading();
  iVar31 = test_xmlXPathLeadingSorted();
  iVar32 = test_xmlXPathLocalNameFunction();
  iVar33 = test_xmlXPathModValues();
  iVar34 = test_xmlXPathMultValues();
  iVar35 = test_xmlXPathNamespaceURIFunction();
  iVar36 = test_xmlXPathNewBoolean();
  iVar37 = test_xmlXPathNewCString();
  iVar38 = test_xmlXPathNewFloat();
  iVar39 = test_xmlXPathNewNodeSet();
  iVar40 = test_xmlXPathNewNodeSetList();
  iVar41 = test_xmlXPathNewParserContext();
  iVar42 = test_xmlXPathNewString();
  iVar43 = test_xmlXPathNextAncestor();
  iVar44 = test_xmlXPathNextAncestorOrSelf();
  iVar45 = test_xmlXPathNextAttribute();
  iVar46 = test_xmlXPathNextChild();
  iVar47 = test_xmlXPathNextDescendant();
  iVar48 = test_xmlXPathNextDescendantOrSelf();
  iVar49 = test_xmlXPathNextFollowing();
  iVar50 = test_xmlXPathNextFollowingSibling();
  iVar51 = test_xmlXPathNextNamespace();
  iVar52 = test_xmlXPathNextParent();
  iVar53 = test_xmlXPathNextPreceding();
  iVar54 = test_xmlXPathNextPrecedingSibling();
  iVar55 = test_xmlXPathNextSelf();
  iVar56 = test_xmlXPathNodeLeading();
  iVar57 = test_xmlXPathNodeLeadingSorted();
  iVar58 = test_xmlXPathNodeSetAdd();
  iVar59 = test_xmlXPathNodeSetAddNs();
  iVar60 = test_xmlXPathNodeSetAddUnique();
  iVar61 = test_xmlXPathNodeSetContains();
  iVar62 = test_xmlXPathNodeSetDel();
  iVar63 = test_xmlXPathNodeSetMerge();
  iVar64 = test_xmlXPathNodeSetRemove();
  iVar65 = test_xmlXPathNodeSetSort();
  iVar66 = test_xmlXPathNodeTrailing();
  iVar67 = test_xmlXPathNodeTrailingSorted();
  iVar68 = test_xmlXPathNormalizeFunction();
  iVar69 = test_xmlXPathNotEqualValues();
  iVar70 = test_xmlXPathNotFunction();
  iVar71 = test_xmlXPathNsLookup();
  iVar72 = test_xmlXPathNumberFunction();
  iVar73 = test_xmlXPathParseNCName();
  iVar74 = test_xmlXPathParseName();
  iVar75 = test_xmlXPathPopBoolean();
  iVar76 = test_xmlXPathPopExternal();
  iVar77 = test_xmlXPathPopNodeSet();
  iVar78 = test_xmlXPathPopNumber();
  iVar79 = test_xmlXPathPopString();
  iVar80 = test_xmlXPathPositionFunction();
  iVar81 = test_xmlXPathRegisterAllFunctions();
  iVar82 = test_xmlXPathRegisterFunc();
  iVar83 = test_xmlXPathRegisterFuncLookup();
  iVar84 = test_xmlXPathRegisterFuncNS();
  iVar85 = test_xmlXPathRegisterNs();
  iVar86 = test_xmlXPathRegisterVariable();
  iVar87 = test_xmlXPathRegisterVariableLookup();
  iVar88 = test_xmlXPathRegisterVariableNS();
  iVar89 = test_xmlXPathRegisteredFuncsCleanup();
  iVar90 = test_xmlXPathRegisteredNsCleanup();
  iVar91 = test_xmlXPathRegisteredVariablesCleanup();
  iVar92 = test_xmlXPathRoot();
  iVar93 = test_xmlXPathRoundFunction();
  iVar94 = test_xmlXPathStartsWithFunction();
  iVar95 = test_xmlXPathStringEvalNumber();
  iVar96 = test_xmlXPathStringFunction();
  iVar97 = test_xmlXPathStringLengthFunction();
  iVar98 = test_xmlXPathSubValues();
  iVar99 = test_xmlXPathSubstringAfterFunction();
  iVar100 = test_xmlXPathSubstringBeforeFunction();
  iVar101 = test_xmlXPathSubstringFunction();
  iVar102 = test_xmlXPathSumFunction();
  iVar103 = test_xmlXPathTrailing();
  iVar104 = test_xmlXPathTrailingSorted();
  iVar105 = test_xmlXPathTranslateFunction();
  iVar106 = test_xmlXPathTrueFunction();
  iVar107 = test_xmlXPathValueFlipSign();
  iVar108 = test_xmlXPathVariableLookup();
  iVar109 = test_xmlXPathVariableLookupNS();
  iVar110 = test_xmlXPathWrapCString();
  iVar111 = test_xmlXPathWrapExternal();
  iVar112 = test_xmlXPathWrapNodeSet();
  iVar113 = test_xmlXPatherror();
  uVar114 = iVar113 + iVar112 + iVar111 + iVar110 + iVar109 + iVar108 + iVar107 + iVar106 + iVar105 
                                                  + iVar104 + iVar103 + iVar102 + iVar101 + iVar100 
                                                  + iVar99 + iVar98 + iVar97 + iVar96 + iVar95 + 
                                                  iVar94 + iVar93 + iVar92 + iVar91 + iVar90 + 
                                                  iVar89 + iVar88 + iVar87 + iVar86 + iVar85 + 
                                                  iVar84 + iVar83 + iVar82 + iVar81 + iVar80 + 
                                                  iVar79 + iVar78 + iVar77 + iVar76 + iVar75 + 
                                                  iVar74 + iVar73 + iVar72 + iVar71 + iVar70 + 
                                                  iVar69 + iVar68 + iVar67 + iVar66 + iVar65 + 
                                                  iVar64 + iVar63 + iVar62 + iVar61 + iVar60 + 
                                                  iVar59 + iVar58 + iVar57 + iVar56 + iVar55 + 
                                                  iVar54 + iVar53 + iVar52 + iVar51 + iVar50 + 
                                                  iVar49 + iVar48 + iVar47 + iVar46 + iVar45 + 
                                                  iVar44 + iVar43 + iVar42 + iVar41 + iVar40 + 
                                                  iVar39 + iVar38 + iVar37 + iVar36 + iVar35 + 
                                                  iVar34 + iVar33 + iVar32 + iVar31 + iVar30 + 
                                                  iVar29 + iVar28 + iVar27 + iVar26 + iVar25 + 
                                                  iVar24 + iVar23 + iVar22 + iVar21 + iVar20 + 
                                                  iVar19 + iVar18 + iVar17 + iVar16 + iVar15 + 
                                                  iVar14 + iVar13 + iVar12 + iVar11 + iVar10 + iVar9
                                                                                               + 
                                                  iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + 
                                                  iVar2 + iVar1;
  if (uVar114 != 0) {
    printf("Module xpathInternals: %d errors\n",(ulong)uVar114);
  }
  return uVar114;
}

Assistant:

static int
test_xpathInternals(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xpathInternals : 106 of 117 functions ...\n");
    test_ret += test_valuePop();
    test_ret += test_valuePush();
    test_ret += test_xmlXPathAddValues();
    test_ret += test_xmlXPathBooleanFunction();
    test_ret += test_xmlXPathCeilingFunction();
    test_ret += test_xmlXPathCompareValues();
    test_ret += test_xmlXPathConcatFunction();
    test_ret += test_xmlXPathContainsFunction();
    test_ret += test_xmlXPathCountFunction();
    test_ret += test_xmlXPathDebugDumpCompExpr();
    test_ret += test_xmlXPathDebugDumpObject();
    test_ret += test_xmlXPathDifference();
    test_ret += test_xmlXPathDistinct();
    test_ret += test_xmlXPathDistinctSorted();
    test_ret += test_xmlXPathDivValues();
    test_ret += test_xmlXPathEqualValues();
    test_ret += test_xmlXPathErr();
    test_ret += test_xmlXPathEvalExpr();
    test_ret += test_xmlXPathEvaluatePredicateResult();
    test_ret += test_xmlXPathFalseFunction();
    test_ret += test_xmlXPathFloorFunction();
    test_ret += test_xmlXPathFunctionLookup();
    test_ret += test_xmlXPathFunctionLookupNS();
    test_ret += test_xmlXPathHasSameNodes();
    test_ret += test_xmlXPathIdFunction();
    test_ret += test_xmlXPathIntersection();
    test_ret += test_xmlXPathIsNodeType();
    test_ret += test_xmlXPathLangFunction();
    test_ret += test_xmlXPathLastFunction();
    test_ret += test_xmlXPathLeading();
    test_ret += test_xmlXPathLeadingSorted();
    test_ret += test_xmlXPathLocalNameFunction();
    test_ret += test_xmlXPathModValues();
    test_ret += test_xmlXPathMultValues();
    test_ret += test_xmlXPathNamespaceURIFunction();
    test_ret += test_xmlXPathNewBoolean();
    test_ret += test_xmlXPathNewCString();
    test_ret += test_xmlXPathNewFloat();
    test_ret += test_xmlXPathNewNodeSet();
    test_ret += test_xmlXPathNewNodeSetList();
    test_ret += test_xmlXPathNewParserContext();
    test_ret += test_xmlXPathNewString();
    test_ret += test_xmlXPathNextAncestor();
    test_ret += test_xmlXPathNextAncestorOrSelf();
    test_ret += test_xmlXPathNextAttribute();
    test_ret += test_xmlXPathNextChild();
    test_ret += test_xmlXPathNextDescendant();
    test_ret += test_xmlXPathNextDescendantOrSelf();
    test_ret += test_xmlXPathNextFollowing();
    test_ret += test_xmlXPathNextFollowingSibling();
    test_ret += test_xmlXPathNextNamespace();
    test_ret += test_xmlXPathNextParent();
    test_ret += test_xmlXPathNextPreceding();
    test_ret += test_xmlXPathNextPrecedingSibling();
    test_ret += test_xmlXPathNextSelf();
    test_ret += test_xmlXPathNodeLeading();
    test_ret += test_xmlXPathNodeLeadingSorted();
    test_ret += test_xmlXPathNodeSetAdd();
    test_ret += test_xmlXPathNodeSetAddNs();
    test_ret += test_xmlXPathNodeSetAddUnique();
    test_ret += test_xmlXPathNodeSetContains();
    test_ret += test_xmlXPathNodeSetDel();
    test_ret += test_xmlXPathNodeSetMerge();
    test_ret += test_xmlXPathNodeSetRemove();
    test_ret += test_xmlXPathNodeSetSort();
    test_ret += test_xmlXPathNodeTrailing();
    test_ret += test_xmlXPathNodeTrailingSorted();
    test_ret += test_xmlXPathNormalizeFunction();
    test_ret += test_xmlXPathNotEqualValues();
    test_ret += test_xmlXPathNotFunction();
    test_ret += test_xmlXPathNsLookup();
    test_ret += test_xmlXPathNumberFunction();
    test_ret += test_xmlXPathParseNCName();
    test_ret += test_xmlXPathParseName();
    test_ret += test_xmlXPathPopBoolean();
    test_ret += test_xmlXPathPopExternal();
    test_ret += test_xmlXPathPopNodeSet();
    test_ret += test_xmlXPathPopNumber();
    test_ret += test_xmlXPathPopString();
    test_ret += test_xmlXPathPositionFunction();
    test_ret += test_xmlXPathRegisterAllFunctions();
    test_ret += test_xmlXPathRegisterFunc();
    test_ret += test_xmlXPathRegisterFuncLookup();
    test_ret += test_xmlXPathRegisterFuncNS();
    test_ret += test_xmlXPathRegisterNs();
    test_ret += test_xmlXPathRegisterVariable();
    test_ret += test_xmlXPathRegisterVariableLookup();
    test_ret += test_xmlXPathRegisterVariableNS();
    test_ret += test_xmlXPathRegisteredFuncsCleanup();
    test_ret += test_xmlXPathRegisteredNsCleanup();
    test_ret += test_xmlXPathRegisteredVariablesCleanup();
    test_ret += test_xmlXPathRoot();
    test_ret += test_xmlXPathRoundFunction();
    test_ret += test_xmlXPathStartsWithFunction();
    test_ret += test_xmlXPathStringEvalNumber();
    test_ret += test_xmlXPathStringFunction();
    test_ret += test_xmlXPathStringLengthFunction();
    test_ret += test_xmlXPathSubValues();
    test_ret += test_xmlXPathSubstringAfterFunction();
    test_ret += test_xmlXPathSubstringBeforeFunction();
    test_ret += test_xmlXPathSubstringFunction();
    test_ret += test_xmlXPathSumFunction();
    test_ret += test_xmlXPathTrailing();
    test_ret += test_xmlXPathTrailingSorted();
    test_ret += test_xmlXPathTranslateFunction();
    test_ret += test_xmlXPathTrueFunction();
    test_ret += test_xmlXPathValueFlipSign();
    test_ret += test_xmlXPathVariableLookup();
    test_ret += test_xmlXPathVariableLookupNS();
    test_ret += test_xmlXPathWrapCString();
    test_ret += test_xmlXPathWrapExternal();
    test_ret += test_xmlXPathWrapNodeSet();
    test_ret += test_xmlXPatherror();

    if (test_ret != 0)
	printf("Module xpathInternals: %d errors\n", test_ret);
    return(test_ret);
}